

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringList.h
# Opt level: O0

void __thiscall
llbuild::basic::StringList::StringList<std::__cxx11::string>
          (StringList *this,
          ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          values)

{
  long lVar1;
  void *__src;
  size_t __n;
  undefined1 *puVar2;
  string local_98 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value_1;
  iterator __end0_1;
  iterator __begin0_1;
  ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range3_1;
  char *p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value;
  iterator __end0;
  iterator __begin0;
  ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range3;
  StringList *this_local;
  ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  values_local;
  
  values_local.Data =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)values.Length;
  this_local = (StringList *)values.Data;
  this->contents = (char *)0x0;
  this->size = 0;
  __end0 = llvm::
           ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::begin((ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&this_local);
  value.field_2._8_8_ =
       llvm::
       ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
       end((ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)&this_local);
  for (; __end0 != (iterator)value.field_2._8_8_; __end0 = __end0 + 1) {
    std::__cxx11::string::string((string *)&p,(string *)__end0);
    lVar1 = std::__cxx11::string::size();
    this->size = lVar1 + 1 + this->size;
    std::__cxx11::string::~string((string *)&p);
  }
  __range3_1 = (ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)operator_new__(this->size + 1);
  this->contents = (char *)__range3_1;
  __end0_1 = llvm::
             ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::begin((ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&this_local);
  value_1.field_2._8_8_ =
       llvm::
       ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
       end((ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)&this_local);
  while( true ) {
    if (__end0_1 == (iterator)value_1.field_2._8_8_) {
      *(undefined1 *)&__range3_1->Data = 0;
      return;
    }
    std::__cxx11::string::string(local_98,(string *)__end0_1);
    lVar1 = std::__cxx11::string::find((char)local_98,0);
    if (lVar1 != -1) break;
    __src = (void *)std::__cxx11::string::data();
    __n = std::__cxx11::string::size();
    memcpy(__range3_1,__src,__n);
    lVar1 = std::__cxx11::string::size();
    puVar2 = (undefined1 *)((long)&__range3_1->Data + lVar1);
    __range3_1 = (ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(puVar2 + 1);
    *puVar2 = 0;
    std::__cxx11::string::~string(local_98);
    __end0_1 = __end0_1 + 1;
  }
  __assert_fail("value.find(\'\\0\') == StringRef::npos",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llbuild/Basic/StringList.h"
                ,0x40,
                "llbuild::basic::StringList::StringList(const ArrayRef<StringType>) [StringType = std::basic_string<char>]"
               );
}

Assistant:

explicit StringList(const ArrayRef<StringType> values) {
    // Construct the concatenated data.
    for (auto value: values) {
      size += value.size() + 1;
    }
    // Make sure to allocate at least 1 byte.
    char* p = nullptr;
    contents = p = new char[size + 1];
    for (auto value: values) {
      assert(value.find('\0') == StringRef::npos);
      memcpy(p, value.data(), value.size());
      p += value.size();
      *p++ = '\0';
    }
    *p = '\0';
  }